

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_plain_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  ID *__k;
  _func_int **pp_Var1;
  ulong uVar2;
  size_t sVar3;
  pointer pcVar4;
  InterfaceBlockMeta *pIVar5;
  bool bVar6;
  bool bVar7;
  bool is_noperspective;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  BuiltIn builtin;
  uint32_t uVar11;
  uint uVar12;
  uint32_t component;
  uint32_t type_id;
  uint uVar13;
  uint32_t uVar14;
  SPIRType *pSVar15;
  SPIRFunction *pSVar16;
  SPIREntryPoint *pSVar17;
  const_iterator cVar18;
  long *plVar19;
  const_iterator cVar20;
  mapped_type *pmVar21;
  code **ppcVar22;
  Bitset *pBVar23;
  const_iterator cVar24;
  mapped_type *pmVar25;
  long *plVar26;
  CompilerMSL *this_00;
  string qual_var_name;
  string mbr_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint local_280;
  byte local_264;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  InterfaceBlockMeta *local_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  SPIRType *local_200;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_1f8;
  string local_1f0;
  _Any_data local_1d0;
  undefined1 local_1c0 [20];
  uint32_t uStack_1ac;
  ID IStack_1a8;
  VariableID VStack_1a4;
  SmallVector<unsigned_int,_8UL> local_1a0;
  SmallVector<bool,_8UL> local_168;
  code *local_148;
  StorageClass local_140;
  undefined1 local_138 [56];
  SmallVector<unsigned_int,_8UL> local_100;
  TypeID local_c8;
  Dim DStack_c4;
  undefined4 uStack_c0;
  uint32_t uStack_bc;
  ImageFormat local_b8;
  AccessQualifier AStack_b4;
  TypeID TStack_b0;
  TypeID TStack_ac;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_a8;
  string local_70;
  string local_50;
  
  bVar6 = Compiler::is_builtin_variable((Compiler *)this,var);
  builtin = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  bVar7 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationFlat);
  is_noperspective =
       Compiler::has_decoration
                 ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationNoPerspective);
  bVar8 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationCentroid);
  bVar9 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationSample);
  uVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  uVar11 = ensure_correct_builtin_type(this,*(uint32_t *)&(var->super_IVariant).field_0xc,builtin);
  *(uint32_t *)&(var->super_IVariant).field_0xc = uVar11;
  local_280 = Compiler::get_pointee_type_id((Compiler *)this,uVar11);
  if (meta->strip_array == true) {
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + local_280);
    bVar10 = Compiler::is_array((Compiler *)this,pSVar15);
    if (bVar10) {
      pSVar15 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + local_280);
      local_280 = (pSVar15->parent_type).id;
    }
  }
  pSVar15 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + local_280);
  uVar13 = pSVar15->vecsize;
  pSVar16 = Variant::get<spirv_cross::SPIRFunction>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_200 = pSVar15;
  bVar10 = add_component_variable_to_interface_block(this,storage,ib_var_ref,var,pSVar15,meta);
  if (bVar10) {
    return;
  }
  __k = &(var->super_IVariant).self;
  local_1f8 = &ib_type->member_types;
  bVar10 = Compiler::has_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
  local_228 = meta;
  if ((((bVar10) && ((this->msl_options).pad_fragment_output_components == true)) &&
      (pSVar17 = Compiler::get_entry_point((Compiler *)this), storage == StorageClassOutput)) &&
     (pSVar17->model == ExecutionModelFragment)) {
    uVar11 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
    local_1d0._0_4_ = uVar11;
    cVar18 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->fragment_output_components)._M_h,
                    (key_type_conflict *)local_1d0._M_pod_data);
    if (cVar18.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) {
      uVar12 = 4;
    }
    else {
      uVar12 = *(uint *)((long)cVar18.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 0xc);
    }
    bVar10 = uVar13 < uVar12;
    if (bVar10) {
      local_280 = build_extended_vector_type(this,local_280,uVar12,Unknown);
    }
LAB_001bcc76:
    local_264 = 0;
    uVar12 = local_280;
  }
  else {
    if (storage != StorageClassInput) {
      bVar10 = false;
      goto LAB_001bcc76;
    }
    local_1d0._0_4_ = __k->id;
    cVar20 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1d0._M_pod_data);
    local_264 = 1;
    if (cVar20.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      bVar10 = false;
      uVar12 = local_280;
    }
    else {
      uVar12 = build_msl_interpolant_type(this,local_280,is_noperspective);
      bVar10 = false;
    }
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
            (local_1f8,
             (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size + 1);
  sVar3 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar3].
  id = uVar12;
  (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
       = sVar3 + 1;
  CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,__k->id,true);
  this_00 = (CompilerMSL *)0x301079;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"m","");
  ensure_valid_name(&local_1f0,this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar11 = (uint32_t)uVar2;
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,&local_1f0);
  pcVar4 = (ib_var_ref->_M_dataplus)._M_p;
  local_1d0._M_unused._M_object = (SPIRVariable *)local_1c0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar4,pcVar4 + ib_var_ref->_M_string_length);
  ::std::__cxx11::string::append(local_1d0._M_pod_data);
  plVar19 = (long *)::std::__cxx11::string::_M_append
                              (local_1d0._M_pod_data,(ulong)local_1f0._M_dataplus._M_p);
  local_220 = &local_210;
  plVar26 = plVar19 + 2;
  if ((long *)*plVar19 == plVar26) {
    local_210 = *plVar26;
    lStack_208 = plVar19[3];
  }
  else {
    local_210 = *plVar26;
    local_220 = (long *)*plVar19;
  }
  local_218 = plVar19[1];
  *plVar19 = (long)plVar26;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((SPIRVariable *)local_1d0._M_unused._0_8_ != (SPIRVariable *)local_1c0) {
    operator_delete(local_1d0._M_unused._M_object);
  }
  if (local_264 != 0) {
    local_1d0._0_4_ = __k->id;
    cVar20 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1d0._M_pod_data);
    if (cVar20.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      if (bVar9 && !bVar8) {
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&local_248,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&local_1d0,(spirv_cross *)".interpolate_at_sample(",
                   (char (*) [24])&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30f9b8,
                   (char (*) [2])pSVar15);
        ::std::__cxx11::string::_M_append((char *)&local_220,local_1d0._M_unused._M_member_pointer);
        if ((SPIRVariable *)local_1d0._M_unused._0_8_ != (SPIRVariable *)local_1c0) {
          operator_delete(local_1d0._M_unused._M_object);
        }
        if ((code **)local_248._M_unused._0_8_ != &local_238) {
          operator_delete(local_248._M_unused._M_object);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)&local_220);
      }
    }
  }
  if (bVar10) {
    uVar14 = (var->super_IVariant).self.id;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
              (&pSVar16->local_variables,
               (pSVar16->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
    sVar3 = (pSVar16->local_variables).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    (pSVar16->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
    [sVar3].id = uVar14;
    (pSVar16->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = sVar3 + 1;
    uVar12 = (var->super_IVariant).self.id;
    SmallVector<unsigned_int,_8UL>::reserve
              (&this->vars_needing_early_declaration,
               (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size + 1
              );
    sVar3 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar3] = uVar12;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar3 + 1;
    pp_Var1 = (_func_int **)(local_1c0 + 0x10);
    local_1d0._M_unused._M_object = var;
    local_1d0._8_8_ = this;
    local_1c0._0_8_ = pp_Var1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c0,local_220,local_218 + (long)local_220);
    local_1a0.super_VectorView<unsigned_int>.ptr._4_4_ = 0;
    local_248._M_unused._M_object = (void *)0x0;
    local_248._8_8_ = 0;
    local_238 = (code *)0x0;
    pcStack_230 = (code *)0x0;
    local_1a0.super_VectorView<unsigned_int>.ptr._0_4_ = uVar13;
    local_248._M_unused._M_object = operator_new(0x38);
    *(void **)local_248._M_unused._0_8_ = local_1d0._M_unused._M_object;
    *(undefined8 *)((long)local_248._M_unused._0_8_ + 8) = local_1d0._8_8_;
    *(code ***)((long)local_248._M_unused._0_8_ + 0x10) =
         (code **)((long)local_248._M_unused._0_8_ + 0x20);
    if ((_func_int **)local_1c0._0_8_ == pp_Var1) {
      *(code **)((long)local_248._M_unused._0_8_ + 0x20) =
           (code *)CONCAT44(uStack_1ac,local_1c0._16_4_);
      *(code **)((long)local_248._M_unused._0_8_ + 0x28) =
           (code *)CONCAT44(VStack_1a4.id,IStack_1a8.id);
    }
    else {
      *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x10) = local_1c0._0_8_;
      *(code **)((long)local_248._M_unused._0_8_ + 0x20) =
           (code *)CONCAT44(uStack_1ac,local_1c0._16_4_);
    }
    *(code **)((long)local_248._M_unused._0_8_ + 0x18) =
         (code *)CONCAT44(local_1c0._12_4_,local_1c0._8_4_);
    local_1c0._8_4_ = 0;
    local_1c0._12_4_ = 0;
    local_1c0._16_4_ = local_1c0._16_4_ & 0xffffff00;
    *(code **)((long)local_248._M_unused._0_8_ + 0x30) =
         (code *)CONCAT44(local_1a0.super_VectorView<unsigned_int>.ptr._4_4_,
                          (uint)local_1a0.super_VectorView<unsigned_int>.ptr);
    pcStack_230 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2623:41)>
                  ::_M_invoke;
    local_238 = ::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2623:41)>
                ::_M_manager;
    local_1c0._0_8_ = pp_Var1;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar16->fixup_hooks_out,(function<void_()> *)&local_248);
    if (local_238 != (code *)0x0) {
      (*local_238)(&local_248,&local_248,3);
    }
    if ((_func_int **)local_1c0._0_8_ != pp_Var1) {
      operator_delete((void *)local_1c0._0_8_);
    }
    if ((var->storage == StorageClassOutput) && ((var->initializer).id != 0)) {
      local_1c0._8_4_ = 0x1f7c02;
      local_1c0._12_4_ = 0;
      local_1c0._0_8_ =
           ::std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2644:8)>
           ::_M_manager;
      local_1d0._M_unused._M_object = var;
      local_1d0._8_8_ = this;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar16->fixup_hooks_in,(function<void_()> *)&local_1d0);
      if ((_func_int **)local_1c0._0_8_ != (_func_int **)0x0) {
        (*(code *)local_1c0._0_8_)(&local_1d0,&local_1d0,3);
      }
    }
  }
  else {
    if (local_228->strip_array == false) {
      pmVar21 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
      ::std::__cxx11::string::_M_assign((string *)&(pmVar21->decoration).qualified_alias);
    }
    if ((var->storage == StorageClassOutput) && ((var->initializer).id != 0)) {
      if (local_228->strip_array == true) {
        local_1d0._M_unused._M_object = var;
        local_1d0._8_8_ = this;
        SPIRType::SPIRType((SPIRType *)local_1c0,ib_type);
        local_238 = (code *)0x0;
        pcStack_230 = (code *)0x0;
        local_248._M_unused._M_object = (void *)0x0;
        local_248._8_8_ = 0;
        ppcVar22 = (code **)operator_new(0x160);
        *ppcVar22 = (code *)local_1d0._M_unused._0_8_;
        ppcVar22[1] = (code *)local_1d0._8_8_;
        *(undefined4 *)(ppcVar22 + 3) = local_1c0._8_4_;
        ppcVar22[2] = (code *)&PTR__SPIRType_003a2fa8;
        *(uint32_t *)((long)ppcVar22 + 0x2c) = VStack_1a4.id;
        *(ulong *)((long)ppcVar22 + 0x1c) = CONCAT44(local_1c0._16_4_,local_1c0._12_4_);
        *(ulong *)((long)ppcVar22 + 0x24) = CONCAT44(IStack_1a8.id,uStack_1ac);
        ppcVar22[7] = (code *)0x0;
        ppcVar22[6] = (code *)(ppcVar22 + 9);
        ppcVar22[8] = (code *)0x8;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(ppcVar22 + 6),&local_1a0);
        ppcVar22[0xe] = (code *)0x0;
        ppcVar22[0xd] = (code *)(ppcVar22 + 0x10);
        ppcVar22[0xf] = (code *)0x8;
        SmallVector<bool,_8UL>::operator=((SmallVector<bool,_8UL> *)(ppcVar22 + 0xd),&local_168);
        ppcVar22[0x11] = local_148;
        *(StorageClass *)(ppcVar22 + 0x12) = local_140;
        ppcVar22[0x14] = (code *)0x0;
        ppcVar22[0x13] = (code *)(ppcVar22 + 0x16);
        ppcVar22[0x15] = (code *)0x8;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   (ppcVar22 + 0x13),
                   (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_138);
        ppcVar22[0x1b] = (code *)0x0;
        ppcVar22[0x1a] = (code *)(ppcVar22 + 0x1d);
        ppcVar22[0x1c] = (code *)0x8;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(ppcVar22 + 0x1a),&local_100);
        *(uint32_t *)(ppcVar22 + 0x21) = local_c8.id;
        *(Dim *)((long)ppcVar22 + 0x10c) = DStack_c4;
        *(undefined4 *)(ppcVar22 + 0x22) = uStack_c0;
        *(uint32_t *)((long)ppcVar22 + 0x114) = uStack_bc;
        *(ImageFormat *)(ppcVar22 + 0x23) = local_b8;
        *(AccessQualifier *)((long)ppcVar22 + 0x11c) = AStack_b4;
        *(uint32_t *)(ppcVar22 + 0x24) = TStack_b0.id;
        *(uint32_t *)((long)ppcVar22 + 0x124) = TStack_ac.id;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)(ppcVar22 + 0x25),&_Stack_a8,&_Stack_a8);
        pcStack_230 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2650:41)>
                      ::_M_invoke;
        local_238 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2650:41)>
                    ::_M_manager;
        local_248._M_unused._0_8_ = ppcVar22;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar16->fixup_hooks_in,(function<void_()> *)&local_248);
        if (local_238 != (code *)0x0) {
          (*local_238)(&local_248,&local_248,3);
        }
        local_1c0._0_8_ = &PTR__SPIRType_003a2fa8;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&_Stack_a8);
        local_100.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_100.super_VectorView<unsigned_int>.ptr !=
            &local_100.stack_storage) {
          free(local_100.super_VectorView<unsigned_int>.ptr);
        }
        local_138._8_8_ = 0;
        if ((TypedID<(spirv_cross::Types)1> *)local_138._0_8_ !=
            (TypedID<(spirv_cross::Types)1> *)(local_138 + 0x18)) {
          free((void *)local_138._0_8_);
        }
        local_168.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)local_168.super_VectorView<bool>.ptr !=
            &local_168.stack_storage) {
          free(local_168.super_VectorView<bool>.ptr);
        }
        local_1a0.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            CONCAT44(local_1a0.super_VectorView<unsigned_int>.ptr._4_4_,
                     (uint)local_1a0.super_VectorView<unsigned_int>.ptr) != &local_1a0.stack_storage
           ) {
          free((undefined1 *)
               CONCAT44(local_1a0.super_VectorView<unsigned_int>.ptr._4_4_,
                        (uint)local_1a0.super_VectorView<unsigned_int>.ptr));
        }
      }
      else {
        pp_Var1 = (_func_int **)(local_1c0 + 0x10);
        local_1d0._M_unused._M_object = var;
        local_1d0._8_8_ = this;
        local_1c0._0_8_ = pp_Var1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c0,local_220,local_218 + (long)local_220);
        local_238 = (code *)0x0;
        pcStack_230 = (code *)0x0;
        local_248._M_unused._M_object = (void *)0x0;
        local_248._8_8_ = 0;
        local_248._M_unused._M_object = operator_new(0x30);
        *(void **)local_248._M_unused._0_8_ = local_1d0._M_unused._M_object;
        *(undefined8 *)((long)local_248._M_unused._0_8_ + 8) = local_1d0._8_8_;
        *(code ***)((long)local_248._M_unused._0_8_ + 0x10) =
             (code **)((long)local_248._M_unused._0_8_ + 0x20);
        if ((_func_int **)local_1c0._0_8_ == pp_Var1) {
          *(code **)((long)local_248._M_unused._0_8_ + 0x20) =
               (code *)CONCAT44(uStack_1ac,local_1c0._16_4_);
          *(code **)((long)local_248._M_unused._0_8_ + 0x28) =
               (code *)CONCAT44(VStack_1a4.id,IStack_1a8.id);
        }
        else {
          *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x10) = local_1c0._0_8_;
          *(code **)((long)local_248._M_unused._0_8_ + 0x20) =
               (code *)CONCAT44(uStack_1ac,local_1c0._16_4_);
        }
        *(code **)((long)local_248._M_unused._0_8_ + 0x18) =
             (code *)CONCAT44(local_1c0._12_4_,local_1c0._8_4_);
        local_1c0._8_4_ = 0;
        local_1c0._12_4_ = 0;
        local_1c0._16_4_ = local_1c0._16_4_ & 0xffffff00;
        pcStack_230 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2661:41)>
                      ::_M_invoke;
        local_238 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2661:41)>
                    ::_M_manager;
        local_1c0._0_8_ = pp_Var1;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar16->fixup_hooks_in,(function<void_()> *)&local_248);
        if (local_238 != (code *)0x0) {
          (*local_238)(&local_248,&local_248,3);
        }
        if ((_func_int **)local_1c0._0_8_ != pp_Var1) {
          operator_delete((void *)local_1c0._0_8_);
        }
      }
    }
  }
  pBVar23 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
  if ((pBVar23->lower & 0x40000000) == 0) {
    if (bVar6) {
      bVar10 = Compiler::is_tessellation_shader((Compiler *)this);
      if ((local_264 & bVar10) != 0) {
        local_1d0._0_4_ = builtin;
        cVar24 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->inputs_by_builtin)._M_h,(key_type_conflict *)local_1d0._M_pod_data);
        if (cVar24.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
            ._M_cur != (__node_type *)0x0) {
          pmVar25 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->inputs_by_builtin,(key_type *)local_1d0._M_pod_data);
          uVar14 = pmVar25->location;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,
                     DecorationLocation,uVar14);
          mark_location_as_used_by_shader(this,uVar14,local_200,StorageClassInput,false);
          goto LAB_001bd6ff;
        }
      }
      if ((storage == StorageClassOutput) && (this->capture_output_to_buffer != false)) {
        local_1d0._0_4_ = builtin;
        cVar24 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->outputs_by_builtin)._M_h,(key_type_conflict *)local_1d0._M_pod_data)
        ;
        if (cVar24.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
            ._M_cur != (__node_type *)0x0) {
          pmVar25 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->outputs_by_builtin,(key_type *)local_1d0._M_pod_data);
          uVar14 = pmVar25->location;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,
                     DecorationLocation,uVar14);
          mark_location_as_used_by_shader(this,uVar14,local_200,StorageClassOutput,false);
        }
      }
    }
  }
  else {
    uVar14 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
    component = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationComponent);
    pIVar5 = local_228;
    if (local_264 != 0) {
      type_id = ensure_correct_input_type
                          (this,*(uint32_t *)&(var->super_IVariant).field_0xc,uVar14,component,0,
                           local_228->strip_array);
      *(uint32_t *)&(var->super_IVariant).field_0xc = type_id;
      local_280 = Compiler::get_pointee_type_id((Compiler *)this,type_id);
      if (pIVar5->strip_array == true) {
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + local_280);
        bVar10 = Compiler::is_array((Compiler *)this,pSVar15);
        if (bVar10) {
          pSVar15 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + local_280);
          local_280 = (pSVar15->parent_type).id;
        }
      }
      local_1d0._0_4_ = __k->id;
      cVar20 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1d0._M_pod_data);
      uVar13 = local_280;
      if (cVar20.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        uVar13 = build_msl_interpolant_type(this,local_280,is_noperspective);
      }
      (local_1f8->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
      [uVar2 & 0xffffffff].id = uVar13;
    }
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,DecorationLocation,
               uVar14);
    if (component != 0) {
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,
                 DecorationComponent,component);
    }
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + local_280);
    mark_location_as_used_by_shader(this,uVar14,pSVar15,storage,false);
  }
LAB_001bd6ff:
  pBVar23 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
  if ((pBVar23->lower & 0x80000000) != 0) {
    uVar14 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationComponent);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,DecorationComponent
               ,uVar14);
  }
  pBVar23 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
  if ((pBVar23->lower & 0x100000000) != 0) {
    uVar14 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationIndex);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,DecorationIndex,
               uVar14);
  }
  if ((bVar6) &&
     (Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,DecorationBuiltIn
                 ,builtin), storage == StorageClassOutput && builtin == BuiltInPosition)) {
    ::std::__cxx11::string::_M_assign((string *)&this->qual_pos_var_name);
  }
  if (local_264 != 0) {
    local_1d0._0_4_ = __k->id;
    cVar20 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1d0._M_pod_data);
    if (cVar20.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
    goto LAB_001bd861;
  }
  if (bVar7) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,DecorationFlat,0);
  }
  if (is_noperspective) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,
               DecorationNoPerspective,0);
  }
  if (bVar8) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,DecorationCentroid,
               0);
  }
  if (bVar9) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar11,DecorationSample,0)
    ;
  }
LAB_001bd861:
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar11,
             SPIRVCrossDecorationInterfaceOrigID,__k->id);
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_plain_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                        SPIRType &ib_type, SPIRVariable &var, InterfaceBlockMeta &meta)
{
	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	// Add a reference to the variable type to the interface struct.
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	uint32_t type_id = ensure_correct_builtin_type(var.basetype, builtin);
	var.basetype = type_id;

	type_id = get_pointee_type_id(var.basetype);
	if (meta.strip_array && is_array(get<SPIRType>(type_id)))
		type_id = get<SPIRType>(type_id).parent_type;
	auto &type = get<SPIRType>(type_id);
	uint32_t target_components = 0;
	uint32_t type_components = type.vecsize;

	bool padded_output = false;
	bool padded_input = false;
	uint32_t start_component = 0;

	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	if (add_component_variable_to_interface_block(storage, ib_var_ref, var, type, meta))
		return;

	bool pad_fragment_output = has_decoration(var.self, DecorationLocation) &&
	                           msl_options.pad_fragment_output_components &&
	                           get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput;

	if (pad_fragment_output)
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		target_components = get_target_components_for_fragment_location(locn);
		if (type_components < target_components)
		{
			// Make a new type here.
			type_id = build_extended_vector_type(type_id, target_components);
			padded_output = true;
		}
	}

	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(type_id, is_noperspective));
	else
		ib_type.member_types.push_back(type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(to_expression(var.self), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	if (padded_output || padded_input)
	{
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		if (padded_output)
		{
			entry_func.fixup_hooks_out.push_back([=, &var]() {
				statement(qual_var_name, vector_swizzle(type_components, start_component), " = ", to_name(var.self),
				          ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				statement(to_name(var.self), " = ", qual_var_name, vector_swizzle(type_components, start_component),
				          ";");
			});
		}
	}
	else if (!meta.strip_array)
		ir.meta[var.self].decoration.qualified_alias = qual_var_name;

	if (var.storage == StorageClassOutput && var.initializer != ID(0))
	{
		if (padded_output || padded_input)
		{
			entry_func.fixup_hooks_in.push_back(
			    [=, &var]() { statement(to_name(var.self), " = ", to_expression(var.initializer), ";"); });
		}
		else
		{
			if (meta.strip_array)
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					uint32_t index = get_extended_decoration(var.self, SPIRVCrossDecorationInterfaceMemberIndex);
					auto invocation = to_tesc_invocation_id();
					statement(to_expression(stage_out_ptr_var_id), "[",
					          invocation, "].",
					          to_member_name(ib_type, index), " = ", to_expression(var.initializer), "[",
					          invocation, "];");
				});
			}
			else
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					statement(qual_var_name, " = ", to_expression(var.initializer), ";");
				});
			}
		}
	}

	// Copy the variable location from the original variable to the member
	if (get_decoration_bitset(var.self).get(DecorationLocation))
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		uint32_t comp = get_decoration(var.self, DecorationComponent);
		if (storage == StorageClassInput)
		{
			type_id = ensure_correct_input_type(var.basetype, locn, comp, 0, meta.strip_array);
			var.basetype = type_id;

			type_id = get_pointee_type_id(type_id);
			if (meta.strip_array && is_array(get<SPIRType>(type_id)))
				type_id = get<SPIRType>(type_id).parent_type;
			if (pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		if (comp)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
		mark_location_as_used_by_shader(locn, get<SPIRType>(type_id), storage);
	}
	else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
	{
		uint32_t locn = inputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		mark_location_as_used_by_shader(locn, type, storage);
	}
	else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
	{
		uint32_t locn = outputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		mark_location_as_used_by_shader(locn, type, storage);
	}

	if (get_decoration_bitset(var.self).get(DecorationComponent))
	{
		uint32_t component = get_decoration(var.self, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, component);
	}

	if (get_decoration_bitset(var.self).get(DecorationIndex))
	{
		uint32_t index = get_decoration(var.self, DecorationIndex);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	// Copy interpolation decorations if needed
	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
}